

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O1

bool __thiscall
MlmWrap::isHfTypeCurrentlySubbed(MlmWrap *this,string *dataName,string *moduleOrigin)

{
  size_t sVar1;
  int iVar2;
  ulong uVar3;
  pointer pHVar4;
  long lVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  HighFreqDataType curType;
  string local_100;
  string local_e0;
  HighFreqDataType local_c0;
  
  pHVar4 = (this->subbedHfDataTypes).
           super__Vector_base<HFSubSockSettings,_std::allocator<HFSubSockSettings>_>._M_impl.
           super__Vector_impl_data._M_start;
  bVar6 = (this->subbedHfDataTypes).
          super__Vector_base<HFSubSockSettings,_std::allocator<HFSubSockSettings>_>._M_impl.
          super__Vector_impl_data._M_finish != pHVar4;
  if (bVar6) {
    lVar5 = 0;
    uVar3 = 0;
    do {
      HighFreqDataType::HighFreqDataType
                (&local_c0,
                 (HighFreqDataType *)
                 ((long)&(pHVar4->dataType).super_NetworkDataType._vptr_NetworkDataType + lVar5));
      HighFreqDataType::getName_abi_cxx11_(&local_100,&local_c0);
      sVar1 = dataName->_M_string_length;
      if (sVar1 == local_100._M_string_length) {
        if (sVar1 == 0) {
          bVar7 = true;
        }
        else {
          iVar2 = bcmp((dataName->_M_dataplus)._M_p,local_100._M_dataplus._M_p,sVar1);
          bVar7 = iVar2 == 0;
        }
      }
      else {
        bVar7 = false;
      }
      if (bVar7) {
        HighFreqDataType::getOrigin_abi_cxx11_(&local_e0,&local_c0);
        sVar1 = moduleOrigin->_M_string_length;
        if (sVar1 != local_e0._M_string_length) goto LAB_002193f0;
        if (sVar1 == 0) {
          bVar8 = true;
        }
        else {
          iVar2 = bcmp((moduleOrigin->_M_dataplus)._M_p,local_e0._M_dataplus._M_p,sVar1);
          bVar8 = iVar2 == 0;
        }
      }
      else {
LAB_002193f0:
        bVar8 = false;
      }
      if ((bVar7) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2)) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
      HighFreqDataType::~HighFreqDataType(&local_c0);
      if (bVar8) {
        return bVar6;
      }
      uVar3 = uVar3 + 1;
      pHVar4 = (this->subbedHfDataTypes).
               super__Vector_base<HFSubSockSettings,_std::allocator<HFSubSockSettings>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0xa8;
      bVar6 = uVar3 < (ulong)(((long)(this->subbedHfDataTypes).
                                     super__Vector_base<HFSubSockSettings,_std::allocator<HFSubSockSettings>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pHVar4 >> 3)
                             * -0x30c30c30c30c30c3);
    } while (bVar6);
  }
  return bVar6;
}

Assistant:

bool MlmWrap::isHfTypeCurrentlySubbed(std::string dataName, std::string moduleOrigin) {
    for (size_t i = 0; i < subbedHfDataTypes.size(); i++) {
        HighFreqDataType curType = subbedHfDataTypes.at(i).dataType;
        if (dataName == curType.getName() && moduleOrigin == curType.getOrigin()) {
            return(true); //if the type is in the availHfDataTypes list
        }
    }

    return(false);
}